

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdinput.c
# Opt level: O1

int consume_markers(j_decompress_ptr cinfo)

{
  ulong uVar1;
  jpeg_input_controller *pjVar2;
  jpeg_error_mgr *pjVar3;
  jpeg_decomp_master *pjVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  int *piVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  pjVar2 = cinfo->inputctl;
  iVar5 = 2;
  if (pjVar2->eoi_reached == 0) {
    iVar5 = (*cinfo->marker->read_markers)(cinfo);
    if (iVar5 == 2) {
      pjVar2->eoi_reached = 1;
      if (*(int *)&pjVar2[1].consume_input == 0) {
        if (cinfo->input_scan_number < cinfo->output_scan_number) {
          cinfo->output_scan_number = cinfo->input_scan_number;
        }
      }
      else if (cinfo->marker->saw_SOF != 0) {
        pjVar3 = cinfo->err;
        pjVar3->msg_code = 0x3b;
        (*pjVar3->error_exit)((j_common_ptr)cinfo);
      }
    }
    else if (iVar5 == 1) {
      if (*(int *)&pjVar2[1].consume_input == 0) {
        if (pjVar2->has_multiple_scans == 0) {
          pjVar3 = cinfo->err;
          pjVar3->msg_code = 0x23;
          (*pjVar3->error_exit)((j_common_ptr)cinfo);
        }
        start_input_pass(cinfo);
      }
      else {
        if ((0xffdc < cinfo->image_height) || (0xffdc < cinfo->image_width)) {
          *(undefined8 *)&cinfo->err->msg_code = 0xffdc00000029;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        iVar8 = cinfo->data_precision;
        if (iVar8 != 8) {
          pjVar3 = cinfo->err;
          pjVar3->msg_code = 0xf;
          (pjVar3->msg_parm).i[0] = iVar8;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        iVar8 = cinfo->num_components;
        if (10 < iVar8) {
          pjVar3 = cinfo->err;
          pjVar3->msg_code = 0x1a;
          (pjVar3->msg_parm).i[0] = iVar8;
          (cinfo->err->msg_parm).i[1] = 10;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        cinfo->max_h_samp_factor = 1;
        cinfo->max_v_samp_factor = 1;
        if (0 < cinfo->num_components) {
          piVar9 = &cinfo->comp_info->h_samp_factor;
          iVar8 = 0;
          do {
            if ((*piVar9 - 5U < 0xfffffffc) || (piVar9[1] - 5U < 0xfffffffc)) {
              pjVar3 = cinfo->err;
              pjVar3->msg_code = 0x12;
              (*pjVar3->error_exit)((j_common_ptr)cinfo);
            }
            uVar12._0_4_ = cinfo->max_h_samp_factor;
            uVar12._4_4_ = cinfo->max_v_samp_factor;
            uVar1 = *(ulong *)piVar9;
            uVar11 = CONCAT44(-(uint)((int)(uVar1 >> 0x20) < (int)uVar12._4_4_),
                              -(uint)((int)uVar1 < (int)(undefined4)uVar12));
            uVar12 = ~uVar11 & uVar1 | uVar12 & uVar11;
            cinfo->max_h_samp_factor = (int)uVar12;
            cinfo->max_v_samp_factor = (int)(uVar12 >> 0x20);
            iVar8 = iVar8 + 1;
            piVar9 = piVar9 + 0x18;
          } while (iVar8 < cinfo->num_components);
        }
        cinfo->min_DCT_scaled_size = 8;
        if (0 < cinfo->num_components) {
          piVar9 = &cinfo->comp_info->h_samp_factor;
          lVar10 = 0;
          do {
            piVar9[7] = 8;
            lVar7 = jdiv_round_up((long)*piVar9 * (ulong)cinfo->image_width,
                                  (long)cinfo->max_h_samp_factor << 3);
            piVar9[5] = (JDIMENSION)lVar7;
            lVar7 = jdiv_round_up((long)piVar9[1] * (ulong)cinfo->image_height,
                                  (long)cinfo->max_v_samp_factor << 3);
            piVar9[6] = (JDIMENSION)lVar7;
            pjVar4 = cinfo->master;
            pjVar4->first_MCU_col[lVar10] = 0;
            pjVar4->last_MCU_col[lVar10] = piVar9[5] - 1;
            lVar7 = jdiv_round_up((long)*piVar9 * (ulong)cinfo->image_width,
                                  (long)cinfo->max_h_samp_factor);
            piVar9[8] = (JDIMENSION)lVar7;
            lVar7 = jdiv_round_up((long)piVar9[1] * (ulong)cinfo->image_height,
                                  (long)cinfo->max_v_samp_factor);
            piVar9[9] = (JDIMENSION)lVar7;
            piVar9[10] = 1;
            *(JQUANT_TBL **)(piVar9 + 0x12) = (JQUANT_TBL *)0x0;
            lVar10 = lVar10 + 1;
            piVar9 = piVar9 + 0x18;
          } while (lVar10 < cinfo->num_components);
        }
        lVar10 = jdiv_round_up((ulong)cinfo->image_height,(long)cinfo->max_v_samp_factor << 3);
        cinfo->total_iMCU_rows = (JDIMENSION)lVar10;
        uVar6 = 1;
        if (cinfo->num_components <= cinfo->comps_in_scan) {
          uVar6 = (uint)(cinfo->progressive_mode != 0);
        }
        cinfo->inputctl->has_multiple_scans = uVar6;
        *(undefined4 *)&pjVar2[1].consume_input = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

METHODDEF(int)
consume_markers(j_decompress_ptr cinfo)
{
  my_inputctl_ptr inputctl = (my_inputctl_ptr)cinfo->inputctl;
  int val;

  if (inputctl->pub.eoi_reached) /* After hitting EOI, read no further */
    return JPEG_REACHED_EOI;

  val = (*cinfo->marker->read_markers) (cinfo);

  switch (val) {
  case JPEG_REACHED_SOS:        /* Found SOS */
    if (inputctl->inheaders) {  /* 1st SOS */
      initial_setup(cinfo);
      inputctl->inheaders = FALSE;
      /* Note: start_input_pass must be called by jdmaster.c
       * before any more input can be consumed.  jdapimin.c is
       * responsible for enforcing this sequencing.
       */
    } else {                    /* 2nd or later SOS marker */
      if (!inputctl->pub.has_multiple_scans)
        ERREXIT(cinfo, JERR_EOI_EXPECTED); /* Oops, I wasn't expecting this! */
      start_input_pass(cinfo);
    }
    break;
  case JPEG_REACHED_EOI:        /* Found EOI */
    inputctl->pub.eoi_reached = TRUE;
    if (inputctl->inheaders) {  /* Tables-only datastream, apparently */
      if (cinfo->marker->saw_SOF)
        ERREXIT(cinfo, JERR_SOF_NO_SOS);
    } else {
      /* Prevent infinite loop in coef ctlr's decompress_data routine
       * if user set output_scan_number larger than number of scans.
       */
      if (cinfo->output_scan_number > cinfo->input_scan_number)
        cinfo->output_scan_number = cinfo->input_scan_number;
    }
    break;
  case JPEG_SUSPENDED:
    break;
  }

  return val;
}